

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPrePartialsPartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  lVar26 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  if (0 < lVar26) {
    iVar25 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
    iVar27 = startPattern * 4;
    lVar29 = 0;
    do {
      if (startPattern < endPattern) {
        lVar30 = (long)iVar27 << 2;
        fVar1 = matrices2[lVar29 * 0x14];
        fVar2 = matrices2[lVar29 * 0x14 + 1];
        fVar3 = matrices2[lVar29 * 0x14 + 2];
        fVar4 = matrices2[lVar29 * 0x14 + 3];
        fVar5 = matrices2[lVar29 * 0x14 + 5];
        fVar6 = matrices2[lVar29 * 0x14 + 6];
        fVar7 = matrices2[lVar29 * 0x14 + 7];
        fVar8 = matrices2[lVar29 * 0x14 + 8];
        fVar9 = matrices2[lVar29 * 0x14 + 10];
        fVar10 = matrices2[lVar29 * 0x14 + 0xb];
        fVar11 = matrices2[lVar29 * 0x14 + 0xc];
        fVar12 = matrices2[lVar29 * 0x14 + 0xd];
        fVar13 = matrices2[lVar29 * 0x14 + 0xf];
        fVar14 = matrices2[lVar29 * 0x14 + 0x10];
        fVar15 = matrices2[lVar29 * 0x14 + 0x11];
        fVar16 = matrices2[lVar29 * 0x14 + 0x12];
        auVar21 = *(undefined1 (*) [16])(matrices1 + lVar29 * 0x14);
        auVar22 = *(undefined1 (*) [16])(matrices1 + lVar29 * 0x14 + 5);
        auVar23 = *(undefined1 (*) [16])(matrices1 + lVar29 * 0x14 + 10);
        auVar24 = *(undefined1 (*) [16])(matrices1 + lVar29 * 0x14 + 0xf);
        iVar28 = endPattern - startPattern;
        do {
          uVar17 = *(uint *)((long)partials2 + lVar30);
          uVar18 = *(uint *)((long)partials2 + lVar30 + 4);
          uVar19 = *(uint *)((long)partials2 + lVar30 + 8);
          uVar20 = *(uint *)((long)partials2 + lVar30 + 0xc);
          auVar31 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416(uVar18));
          auVar31 = vfmadd231ss_avx512f(auVar31,ZEXT416((uint)fVar1),ZEXT416(uVar17));
          auVar31 = vfmadd231ss_avx512f(auVar31,ZEXT416((uint)fVar3),ZEXT416(uVar19));
          auVar31 = vfmadd231ss_avx512f(auVar31,ZEXT416((uint)fVar4),ZEXT416(uVar20));
          auVar32 = vmulss_avx512f(ZEXT416((uint)fVar6),ZEXT416(uVar18));
          auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)fVar5),ZEXT416(uVar17));
          auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)fVar7),ZEXT416(uVar19));
          auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)fVar8),ZEXT416(uVar20));
          auVar33 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416(uVar18));
          auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar9),ZEXT416(uVar17));
          auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar11),ZEXT416(uVar19));
          auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar12),ZEXT416(uVar20));
          auVar34 = vmulss_avx512f(ZEXT416((uint)fVar14),ZEXT416(uVar18));
          auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)fVar13),ZEXT416(uVar17));
          auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)fVar15),ZEXT416(uVar19));
          auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)fVar16),ZEXT416(uVar20));
          auVar31 = vmulss_avx512f(auVar31,ZEXT416(*(uint *)((long)partials1 + lVar30)));
          auVar32 = vmulss_avx512f(auVar32,ZEXT416(*(uint *)((long)partials1 + lVar30 + 4)));
          auVar33 = vmulss_avx512f(auVar33,ZEXT416(*(uint *)((long)partials1 + lVar30 + 8)));
          auVar34 = vmulss_avx512f(auVar34,ZEXT416(*(uint *)((long)partials1 + lVar30 + 0xc)));
          auVar32 = vbroadcastss_avx512vl(auVar32);
          auVar32 = vmulps_avx512vl(auVar22,auVar32);
          auVar31 = vbroadcastss_avx512vl(auVar31);
          auVar31 = vfmadd213ps_avx512vl(auVar31,auVar21,auVar32);
          auVar32 = vbroadcastss_avx512vl(auVar33);
          auVar31 = vfmadd213ps_avx512vl(auVar32,auVar23,auVar31);
          auVar32 = vbroadcastss_avx512vl(auVar34);
          auVar31 = vfmadd213ps_avx512vl(auVar32,auVar24,auVar31);
          *(undefined1 (*) [16])((long)destP + lVar30) = auVar31;
          lVar30 = lVar30 + 0x10;
          iVar28 = iVar28 + -1;
        } while (iVar28 != 0);
      }
      lVar29 = lVar29 + 1;
      iVar27 = iVar27 + iVar25 * 4;
    } while (lVar29 != lVar26);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsPartials(REALTYPE* destP,
                                                                   const REALTYPE* partials1,
                                                                   const REALTYPE* matrices1,
                                                                   const REALTYPE* partials2,
                                                                   const REALTYPE* matrices2,
                                                                   int startPattern,
                                                                   int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
            u += 4*startPattern;
        }
        int w = l*4*OFFSET;


        PREFETCH_MATRIX(2,matrices2,w); // m200, m201, ..., m233
        PREFETCH_MATRIX_TRANSPOSE(1,matrices1,w); //m100, m101, ..., m133
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(2,partials2,u); // p20, p21, p22, p23
            PREFETCH_PARTIALS(1,partials1,u); // p10, p11, p12, p13

            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23
            DO_SCHUR_PRODUCT(1, 1, 2); // reWrites p10, p11, p12, p13

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13

            // Final results
            destP[u    ] = sum10;
            destP[u + 1] = sum11;
            destP[u + 2] = sum12;
            destP[u + 3] = sum13;

            u += 4;

        }
    }
}